

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O3

void __thiscall
libtorrent::torrent_info::set_web_seeds
          (torrent_info *this,
          vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_> *seeds)

{
  pointer pwVar1;
  vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_> local_18;
  
  local_18.
  super__Vector_base<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->m_web_seeds).
       super__Vector_base<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  pwVar1 = (seeds->
           super__Vector_base<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_18.
  super__Vector_base<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (this->m_web_seeds).
       super__Vector_base<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_18.
  super__Vector_base<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (this->m_web_seeds).
       super__Vector_base<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->m_web_seeds).
  super__Vector_base<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (seeds->
       super__Vector_base<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>).
       _M_impl.super__Vector_impl_data._M_start;
  (this->m_web_seeds).
  super__Vector_base<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>.
  _M_impl.super__Vector_impl_data._M_finish = pwVar1;
  (this->m_web_seeds).
  super__Vector_base<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (seeds->
       super__Vector_base<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>).
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (seeds->
  super__Vector_base<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (seeds->
  super__Vector_base<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (seeds->
  super__Vector_base<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>::~vector
            (&local_18);
  return;
}

Assistant:

void torrent_info::set_web_seeds(std::vector<web_seed_entry> seeds)
	{
		m_web_seeds = std::move(seeds);
	}